

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlReaderWalker(xmlDocPtr doc)

{
  xmlDictPtr pxVar1;
  xmlTextReaderPtr ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x160);
    if (doc_local == (xmlDocPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x160);
      *(undefined4 *)&doc_local[1]._private = 0;
      doc_local->next = (_xmlNode *)0x0;
      *(undefined4 *)&doc_local->_private = 0;
      doc_local->encoding = (xmlChar *)0x0;
      doc_local->ids = (void *)0x0;
      *(undefined4 *)&doc_local->version = 0;
      *(undefined4 *)((long)&doc_local->version + 4) = 0;
      *(undefined4 *)((long)&doc_local->name + 4) = 2;
      *(xmlDocPtr *)&doc_local->type = doc;
      *(undefined4 *)&doc_local->children = 0;
      pxVar1 = xmlDictCreate();
      doc_local->psvi = pxVar1;
    }
  }
  return (xmlTextReaderPtr)doc_local;
}

Assistant:

xmlTextReaderPtr
xmlReaderWalker(xmlDocPtr doc)
{
    xmlTextReaderPtr ret;

    if (doc == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL) {
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlTextReader));
    ret->entNr = 0;
    ret->input = NULL;
    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    ret->base = 0;
    ret->cur = 0;
    ret->allocs = XML_TEXTREADER_CTXT;
    ret->doc = doc;
    ret->state = XML_TEXTREADER_START;
    ret->dict = xmlDictCreate();
    return(ret);
}